

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void BeginVisitBlock(ParseNodeBlock *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *pSVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = BlockHasOwnScope(pnode,byteCodeGenerator);
  if (bVar2) {
    pSVar1 = pnode->scope;
    if ((pSVar1->scopeType < ScopeType_With) && ((0xe4U >> (pSVar1->scopeType & 0x1f) & 1) != 0)) {
      uVar3 = FuncInfo::AcquireInnerScopeIndex(pSVar1->func);
      pSVar1->innerScopeIndex = uVar3;
    }
    pnode->enclosingBlock = byteCodeGenerator->currentBlock;
    byteCodeGenerator->currentBlock = pnode;
    ByteCodeGenerator::PushScope(byteCodeGenerator,pnode->scope);
    return;
  }
  return;
}

Assistant:

void BeginVisitBlock(ParseNodeBlock *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (BlockHasOwnScope(pnode, byteCodeGenerator))
    {
        Scope *scope = pnode->scope;
        FuncInfo *func = scope->GetFunc();

        if (scope->IsInnerScope())
        {
            // Give this scope an index so its slots can be accessed via the index in the byte code,
            // not a register.
            scope->SetInnerScopeIndex(func->AcquireInnerScopeIndex());
        }

        byteCodeGenerator->PushBlock(pnode);
        byteCodeGenerator->PushScope(pnode->scope);
    }
}